

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Shader::tokenize(Shader *this,GeneratorState *state,TokenStream *str)

{
  Type TVar1;
  Shader *this_00;
  TokenStream *pTVar2;
  size_type sVar3;
  const_reference ppSVar4;
  const_reference ppFVar5;
  Token local_a8;
  Token local_98;
  int local_88;
  int local_84;
  int ndx_1;
  int ndx;
  Token local_70;
  Token local_60;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  Shader *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  this_00 = GeneratorState::getShader(state);
  TVar1 = getType(this_00);
  pTVar2 = local_20;
  if (TVar1 == TYPE_FRAGMENT) {
    Token::Token(&local_30,PRECISION);
    pTVar2 = TokenStream::operator<<(pTVar2,&local_30);
    Token::Token(local_50,MEDIUM_PRECISION);
    pTVar2 = TokenStream::operator<<(pTVar2,local_50);
    Token::Token(&local_60,FLOAT);
    pTVar2 = TokenStream::operator<<(pTVar2,&local_60);
    Token::Token(&local_70,SEMICOLON);
    pTVar2 = TokenStream::operator<<(pTVar2,&local_70);
    Token::Token((Token *)&ndx_1,NEWLINE);
    TokenStream::operator<<(pTVar2,(Token *)&ndx_1);
    Token::~Token((Token *)&ndx_1);
    Token::~Token(&local_70);
    Token::~Token(&local_60);
    Token::~Token(local_50);
    Token::~Token(&local_30);
  }
  sVar3 = std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::size
                    (&this->m_globalStatements);
  local_84 = (int)sVar3;
  while (local_84 = local_84 + -1, -1 < local_84) {
    ppSVar4 = std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::operator[]
                        (&this->m_globalStatements,(long)local_84);
    (*(*ppSVar4)->_vptr_Statement[3])(*ppSVar4,str_local,local_20);
  }
  sVar3 = std::vector<rsg::Function_*,_std::allocator<rsg::Function_*>_>::size(&this->m_functions);
  local_88 = (int)sVar3;
  while (pTVar2 = local_20, local_88 = local_88 + -1, -1 < local_88) {
    Token::Token(&local_98,NEWLINE);
    TokenStream::operator<<(pTVar2,&local_98);
    Token::~Token(&local_98);
    ppFVar5 = std::vector<rsg::Function_*,_std::allocator<rsg::Function_*>_>::operator[]
                        (&this->m_functions,(long)local_88);
    Function::tokenize(*ppFVar5,(GeneratorState *)str_local,local_20);
  }
  Token::Token(&local_a8,NEWLINE);
  TokenStream::operator<<(pTVar2,&local_a8);
  Token::~Token(&local_a8);
  Function::tokenize(&this->m_mainFunction,(GeneratorState *)str_local,local_20);
  return;
}

Assistant:

void Shader::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Add default precision for float in fragment shaders \todo [pyry] Proper precision handling
	if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
		str << Token::PRECISION << Token::MEDIUM_PRECISION << Token::FLOAT << Token::SEMICOLON << Token::NEWLINE;

	// Tokenize global declaration statements
	for (int ndx = (int)m_globalStatements.size()-1; ndx >= 0; ndx--)
		m_globalStatements[ndx]->tokenize(state, str);

	// Tokenize all functions
	for (int ndx = (int)m_functions.size()-1; ndx >= 0; ndx--)
	{
		str << Token::NEWLINE;
		m_functions[ndx]->tokenize(state, str);
	}

	// Tokenize main
	str << Token::NEWLINE;
	m_mainFunction.tokenize(state, str);
}